

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

float * Abc_NtkGetCoRequiredFloats(Abc_Ntk_t *pNtk)

{
  float *pfVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  long lVar3;
  float fVar4;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pfVar1 = (float *)0x0;
  }
  else {
    iVar2 = pNtk->vCos->nSize;
    pfVar1 = (float *)calloc((long)iVar2,4);
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      pNode = Abc_NtkCo(pNtk,(int)lVar3);
      fVar4 = Abc_NodeReadRequiredWorst(pNode);
      pfVar1[lVar3] = fVar4;
      iVar2 = pNtk->vCos->nSize;
    }
  }
  return pfVar1;
}

Assistant:

float * Abc_NtkGetCoRequiredFloats( Abc_Ntk_t * pNtk )
{
    float * p;
    Abc_Obj_t * pNode;
    int i;
    if ( pNtk->pManTime == NULL )
        return NULL;
    // set the PO required times
    p = ABC_CALLOC( float, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        p[i] = Abc_NodeReadRequiredWorst(pNode);
    return p;
}